

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

void __thiscall ON_SubDComponentRefList::Internal_Destroy(ON_SubDComponentRefList *this)

{
  ON_SubDComponentRef *pOVar1;
  uint uVar2;
  ON_SubDComponentRef **ppOVar3;
  ON_SubDComponentRef *p;
  uint i;
  ON_SubDComponentRefList *this_local;
  
  for (p._4_4_ = 0; uVar2 = ON_SimpleArray<ON_SubDComponentRef_*>::UnsignedCount(&this->m_list),
      p._4_4_ < uVar2; p._4_4_ = p._4_4_ + 1) {
    ppOVar3 = ON_SimpleArray<ON_SubDComponentRef_*>::operator[](&this->m_list,p._4_4_);
    pOVar1 = *ppOVar3;
    ppOVar3 = ON_SimpleArray<ON_SubDComponentRef_*>::operator[](&this->m_list,p._4_4_);
    *ppOVar3 = (ON_SubDComponentRef *)0x0;
    if ((pOVar1 != (ON_SubDComponentRef *)0x0) && (pOVar1 != (ON_SubDComponentRef *)0x0)) {
      (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
  }
  ON_SimpleArray<ON_SubDComponentRef_*>::SetCount(&this->m_list,0);
  this->m_bIsClean = false;
  return;
}

Assistant:

void ON_SubDComponentRefList::Internal_Destroy()
{
  for (unsigned int i = 0; i < m_list.UnsignedCount(); i++)
  {
    ON_SubDComponentRef* p = m_list[i];
    m_list[i] = nullptr;
    if (nullptr != p)
      delete p;
  }
  m_list.SetCount(0);
  m_bIsClean = false;
}